

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O2

int DataManager::getLinkNodes(int index,int *fromNode,int *toNode,Network *nw)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__to;
  char *__to_00;
  
  *fromNode = -1;
  *toNode = -1;
  iVar2 = 0xcd;
  if (-1 < index) {
    iVar1 = Network::count(nw,LINK);
    if (index < iVar1) {
      iVar2 = Network::link(nw,(char *)(ulong)(uint)index,__to);
      *fromNode = *(int *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x30) + 0x28);
      iVar2 = Network::link(nw,(char *)(ulong)(uint)index,__to_00);
      *toNode = *(int *)(*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x38) + 0x28);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int DataManager::getLinkNodes(int index, int* fromNode, int* toNode, Network* nw)
{
    *fromNode = -1;
    *toNode = -1;
    if ( index < 0 || index >= nw->count(Element::LINK) ) return 205;
    *fromNode = nw->link(index)->fromNode->index;
    *toNode = nw->link(index)->toNode->index;
    return 0;
}